

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureSocket.cpp
# Opt level: O3

int __thiscall Jupiter::SecureSocket::close(SecureSocket *this,int __fd)

{
  int iVar1;
  SSLData *pSVar2;
  
  Socket::close(&this->super_Socket,__fd);
  pSVar2 = this->m_ssl_data;
  if ((pSVar2 != (SSLData *)0x0) && ((SSL *)pSVar2->handle != (SSL *)0x0)) {
    iVar1 = SSL_shutdown((SSL *)pSVar2->handle);
    if (iVar1 == 0) {
      SSL_shutdown((SSL *)this->m_ssl_data->handle);
    }
    SSL_free((SSL *)this->m_ssl_data->handle);
    pSVar2 = this->m_ssl_data;
    pSVar2->handle = (SSL *)0x0;
  }
  return (int)pSVar2;
}

Assistant:

void Jupiter::SecureSocket::close() {
	Jupiter::Socket::close();
	if (m_ssl_data != nullptr && m_ssl_data->handle != nullptr) {
		if (SSL_shutdown(m_ssl_data->handle) == 0) {
			SSL_shutdown(m_ssl_data->handle);
		}
		SSL_free(m_ssl_data->handle);
		m_ssl_data->handle = nullptr;
	}
}